

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_array_benchmark.cc
# Opt level: O3

int main(int argc,char **argv)

{
  long *plVar1;
  byte bVar2;
  __time_t _Var3;
  __suseconds_t _Var4;
  size_t i;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  sbyte sVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  timeval now;
  timeval local_48;
  long local_38;
  
  if (1 < argc) {
    fprintf(_stderr,"%s does not take any arguments.\n",*argv);
  }
  pvVar5 = operator_new__(0x17700000);
  uVar12 = 0;
  memset(pvVar5,0,0x17700000);
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  _Var4 = local_48.tv_usec;
  _Var3 = local_48.tv_sec;
  uVar6 = 0;
  do {
    uVar9 = (uint)uVar12 & 0x3e;
    uVar10 = uVar12 >> 6;
    uVar11 = *(ulong *)((long)pvVar5 + uVar10 * 8);
    sVar8 = (sbyte)uVar9;
    if ((ulong)uVar9 < 0x23) {
      uVar11 = uVar6 << sVar8 |
               (*(ulong *)(bitmap::low_bits_set + (ulong)uVar9 * 8) |
               *(ulong *)(bitmap::low_bits_unset + (ulong)uVar9 * 8 + 0xf0)) & uVar11;
    }
    else {
      uVar11 = uVar6 << sVar8 | *(ulong *)(bitmap::low_bits_set + (ulong)uVar9 * 8) & uVar11;
      *(ulong *)((long)pvVar5 + uVar10 * 8 + 8) =
           uVar6 >> (-sVar8 & 0x3fU) |
           *(ulong *)(bitmap::low_bits_unset + (ulong)(uVar9 + 0x1e & 0x3e) * 8) &
           *(ulong *)((long)pvVar5 + uVar10 * 8 + 8);
    }
    *(ulong *)((long)pvVar5 + uVar10 * 8) = uVar11;
    uVar6 = uVar6 + 1;
    uVar12 = uVar12 + 0x1e;
  } while (uVar6 != 0x6400000);
  uVar6 = 0;
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  fprintf(_stderr,"Time to fill Unsigned Bitmap Array = %llu\n",
          (local_48.tv_sec - _Var3) * 1000000 + (local_48.tv_usec - _Var4));
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  _Var4 = local_48.tv_usec;
  local_38 = local_48.tv_sec;
  lVar7 = 0x6400000;
  lVar13 = 0;
  do {
    uVar9 = (uint)uVar6 & 0x3e;
    uVar12 = *(ulong *)((long)pvVar5 + (uVar6 >> 6) * 8);
    if (uVar9 < 0x23) {
      uVar9 = (uint)(uVar12 >> (sbyte)uVar9);
    }
    else {
      bVar2 = (byte)uVar6 & 0x3f;
      uVar9 = (uint)(uVar12 >> bVar2) |
              (uint)(*(long *)((long)pvVar5 + (uVar6 >> 6) * 8 + 8) << 0x40 - bVar2);
    }
    lVar13 = lVar13 + (ulong)(uVar9 & 0x3fffffff);
    uVar6 = uVar6 + 0x1e;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  uVar12 = 0;
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  fprintf(_stderr,"Time to read Unsigned Bitmap Array = %llu; sum=%lld\n",
          (local_48.tv_sec - local_38) * 1000000 + (local_48.tv_usec - _Var4),lVar13);
  operator_delete__(pvVar5);
  pvVar5 = operator_new__(0x18380000);
  memset(pvVar5,0,0x18380000);
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  _Var4 = local_48.tv_usec;
  local_38 = local_48.tv_sec;
  uVar6 = 0;
  do {
    uVar9 = (uint)uVar12 & 0x3f;
    uVar10 = uVar12 >> 6;
    uVar11 = *(ulong *)((long)pvVar5 + uVar10 * 8);
    sVar8 = (sbyte)uVar9;
    if ((ulong)uVar9 < 0x22) {
      uVar11 = uVar6 << sVar8 |
               (*(ulong *)(bitmap::low_bits_set + (ulong)uVar9 * 8) |
               *(ulong *)(bitmap::low_bits_unset + (ulong)uVar9 * 8 + 0xf8)) & uVar11;
    }
    else {
      uVar11 = uVar6 << sVar8 | *(ulong *)(bitmap::low_bits_set + (ulong)uVar9 * 8) & uVar11;
      *(ulong *)((long)pvVar5 + uVar10 * 8 + 8) =
           uVar6 >> (-sVar8 & 0x3fU) |
           *(ulong *)(bitmap::low_bits_unset + (ulong)(uVar9 + 0x1f & 0x3f) * 8) &
           *(ulong *)((long)pvVar5 + uVar10 * 8 + 8);
    }
    *(ulong *)((long)pvVar5 + uVar10 * 8) = uVar11;
    uVar6 = uVar6 + 2;
    uVar12 = uVar12 + 0x1f;
  } while (uVar6 != 0xc800000);
  uVar6 = 0;
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  fprintf(_stderr,"Time to fill Signed Bitmap Array = %llu\n",
          (local_48.tv_sec - local_38) * 1000000 + (local_48.tv_usec - _Var4));
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  _Var4 = local_48.tv_usec;
  _Var3 = local_48.tv_sec;
  lVar7 = 0x6400000;
  lVar13 = 0;
  do {
    uVar9 = (uint)uVar6 & 0x3f;
    uVar12 = *(ulong *)((long)pvVar5 + (uVar6 >> 6) * 8);
    if (uVar9 < 0x23) {
      uVar12 = uVar12 >> (sbyte)uVar9;
    }
    else {
      bVar2 = (byte)uVar6 & 0x3f;
      uVar12 = uVar12 >> bVar2 | *(long *)((long)pvVar5 + (uVar6 >> 6) * 8 + 8) << 0x40 - bVar2;
    }
    uVar10 = (ulong)((uint)(uVar12 >> 1) & 0x1fffffff);
    uVar11 = -uVar10;
    if ((uVar12 & 1) == 0) {
      uVar11 = uVar10;
    }
    lVar13 = lVar13 + uVar11;
    uVar6 = uVar6 + 0x1f;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  lVar7 = 0;
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  fprintf(_stderr,"Time to read Signed Bitmap Array = %llu; sum=%lld\n",
          (local_48.tv_sec - _Var3) * 1000000 + (local_48.tv_usec - _Var4),lVar13);
  operator_delete__(pvVar5);
  pvVar5 = operator_new__(0x32000000);
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  _Var4 = local_48.tv_usec;
  _Var3 = local_48.tv_sec;
  lVar13 = 0;
  lVar14 = 1;
  do {
    plVar1 = (long *)((long)pvVar5 + lVar7 * 8);
    *plVar1 = lVar13;
    plVar1[1] = lVar14;
    lVar7 = lVar7 + 2;
    lVar13 = lVar13 + 2;
    lVar14 = lVar14 + 2;
  } while (lVar7 != 0x6400000);
  lVar7 = 0;
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  fprintf(_stderr,"Time to fill Array = %llu\n",
          (local_48.tv_sec - _Var3) * 1000000 + (local_48.tv_usec - _Var4));
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  _Var4 = local_48.tv_usec;
  _Var3 = local_48.tv_sec;
  lVar13 = 0;
  lVar14 = 0;
  do {
    plVar1 = (long *)((long)pvVar5 + lVar7 * 8);
    lVar13 = lVar13 + *plVar1;
    lVar14 = lVar14 + plVar1[1];
    lVar7 = lVar7 + 2;
  } while (lVar7 != 0x6400000);
  gettimeofday(&local_48,(__timezone_ptr_t)0x0);
  fprintf(_stderr,"Time to read Array = %llu; sum=%lld\n",
          (local_48.tv_sec - _Var3) * 1000000 + (local_48.tv_usec - _Var4),lVar14 + lVar13);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  if (argc > 1) {
    fprintf(stderr, "%s does not take any arguments.\n", argv[0]);
  }

  TimeStamp t0, t1;

  {
    bitmap::UnsignedBitmapArray<uint64_t> array(ARRAY_SIZE, 30);

    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      array.Set(i, i);
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to fill Unsigned Bitmap Array = %llu\n", (t1 - t0));

    int64_t sum = 0;
    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      // assert(array[i] == i);
      sum += array.Get(i);
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to read Unsigned Bitmap Array = %llu; sum=%lld\n",
            (t1 - t0), sum);
  }
  {
    bitmap::SignedBitmapArray<int64_t> array(ARRAY_SIZE, 30);

    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      array.Set(i, i);
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to fill Signed Bitmap Array = %llu\n", (t1 - t0));

    int64_t sum = 0;
    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      // assert(array[i] == i);
      sum += array.Get(i);
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to read Signed Bitmap Array = %llu; sum=%lld\n",
            (t1 - t0), sum);
  }

  {
    int64_t *array = new int64_t[ARRAY_SIZE];
    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      array[i] = i;
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to fill Array = %llu\n", (t1 - t0));

    int64_t sum = 0;
    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      sum += array[i];
    }
    t1 = GetTimestamp();
    fprintf(stderr, "Time to read Array = %llu; sum=%lld\n", (t1 - t0), sum);
  }
}